

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

bool * __thiscall JSON::JSONValue::getBoolValue(JSONValue *this)

{
  ostream *poVar1;
  string local_38;
  
  if (this->type != BOOLEAN) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON bool value from ");
    getTypeAsString_abi_cxx11_(&local_38,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->type);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_38);
    local_38._M_dataplus._M_p._0_1_ = 0;
    setBoolValue(this,(bool *)&local_38);
  }
  return (bool *)this->data;
}

Assistant:

bool &JSONValue::getBoolValue() {
	if(getType()!=BOOLEAN)
	{
		#ifdef JSON_TYPE_ERRORS_ON
		cerr << "Error requesting JSON bool value from " << getTypeAsString() << " (" << getType() << ")" << endl;
		#endif
		setBoolValue(false);
	}
	return *((bool*)data);
}